

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_RH_PROVISION_Unmarshal(TPMI_RH_PROVISION *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_RH_PROVISION *target_local;
  
  target_local._4_4_ = UINT32_Unmarshal(target,buffer,size);
  if (target_local._4_4_ == 0) {
    if ((*target == 0x40000001) || (*target == 0x4000000c)) {
      target_local._4_4_ = 0;
    }
    else {
      target_local._4_4_ = 0x84;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMI_RH_PROVISION_Unmarshal(TPMI_RH_PROVISION *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_OWNER:
        case TPM_RH_PLATFORM:
            break;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}